

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

z_size_t gz_read(gz_statep state,voidp buf,z_size_t len)

{
  uchar **ppuVar1;
  off64_t *poVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong in_RAX;
  z_size_t zVar7;
  undefined8 uStack_38;
  
  if (len == 0) {
LAB_00106667:
    zVar7 = 0;
  }
  else {
    uStack_38 = in_RAX;
    if (state->seek != 0) {
      state->seek = 0;
      iVar5 = gz_skip(state,state->skip);
      if (iVar5 == -1) goto LAB_00106667;
    }
    zVar7 = 0;
    do {
      uVar6 = 0xffffffff;
      if (len < 0xffffffff) {
        uVar6 = (uint)len;
      }
      uStack_38 = CONCAT44(uVar6,(undefined4)uStack_38);
      uVar3 = (state->x).have;
      if (uVar3 == 0) {
        if ((state->eof != 0) && ((state->strm).avail_in == 0)) {
          state->past = 1;
          return zVar7;
        }
        if ((state->how != 0) && (state->size * 2 <= uVar6)) {
          if (state->how == 1) {
            iVar5 = gz_load(state,(uchar *)buf,uVar6,(uint *)((long)&uStack_38 + 4));
            if (iVar5 != -1) goto LAB_001065d2;
          }
          else {
            (state->strm).avail_out = uVar6;
            (state->strm).next_out = (Bytef *)buf;
            iVar5 = gz_decomp(state);
            if (iVar5 != -1) {
              uStack_38 = CONCAT44((state->x).have,(undefined4)uStack_38);
              uVar6 = 0;
              goto LAB_001065cf;
            }
          }
          goto LAB_00106667;
        }
        iVar5 = gz_fetch(state);
        if (iVar5 == -1) goto LAB_00106667;
      }
      else {
        if (uVar3 < uVar6) {
          uStack_38 = CONCAT44(uVar3,(undefined4)uStack_38);
        }
        memcpy(buf,(state->x).next,uStack_38 >> 0x20);
        ppuVar1 = &(state->x).next;
        *ppuVar1 = *ppuVar1 + uStack_38._4_4_;
        uVar6 = (state->x).have - uStack_38._4_4_;
LAB_001065cf:
        (state->x).have = uVar6;
LAB_001065d2:
        uVar4 = uStack_38 >> 0x20;
        len = len - uVar4;
        buf = (voidp)((long)buf + uVar4);
        zVar7 = zVar7 + uVar4;
        poVar2 = &(state->x).pos;
        *poVar2 = *poVar2 + uVar4;
      }
    } while (len != 0);
  }
  return zVar7;
}

Assistant:

local z_size_t gz_read(state, buf, len)
    gz_statep state;
    voidp buf;
    z_size_t len;
{
    z_size_t got;
    unsigned n;

    /* if len is zero, avoid unnecessary operations */
    if (len == 0)
        return 0;

    /* process a skip request */
    if (state->seek) {
        state->seek = 0;
        if (gz_skip(state, state->skip) == -1)
            return 0;
    }

    /* get len bytes to buf, or less than len if at the end */
    got = 0;
    do {
        /* set n to the maximum amount of len that fits in an unsigned int */
        n = -1;
        if (n > len)
            n = len;

        /* first just try copying data from the output buffer */
        if (state->x.have) {
            if (state->x.have < n)
                n = state->x.have;
            memcpy(buf, state->x.next, n);
            state->x.next += n;
            state->x.have -= n;
        }

        /* output buffer empty -- return if we're at the end of the input */
        else if (state->eof && state->strm.avail_in == 0) {
            state->past = 1;        /* tried to read past end */
            break;
        }

        /* need output data -- for small len or new stream load up our output
           buffer */
        else if (state->how == LOOK || n < (state->size << 1)) {
            /* get more output, looking for header if required */
            if (gz_fetch(state) == -1)
                return 0;
            continue;       /* no progress yet -- go back to copy above */
            /* the copy above assures that we will leave with space in the
               output buffer, allowing at least one gzungetc() to succeed */
        }

        /* large len -- read directly into user buffer */
        else if (state->how == COPY) {      /* read directly */
            if (gz_load(state, (unsigned char *)buf, n, &n) == -1)
                return 0;
        }

        /* large len -- decompress directly into user buffer */
        else {  /* state->how == GZIP */
            state->strm.avail_out = n;
            state->strm.next_out = (unsigned char *)buf;
            if (gz_decomp(state) == -1)
                return 0;
            n = state->x.have;
            state->x.have = 0;
        }

        /* update progress */
        len -= n;
        buf = (char *)buf + n;
        got += n;
        state->x.pos += n;
    } while (len);

    /* return number of bytes read into user buffer */
    return got;
}